

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapeTetra>::HDivPermutation
               (int side,TPZShapeData *data,TPZVec<int> *permutegather)

{
  int iVar1;
  uint uVar2;
  MElementType eltype;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  TPZManVector<long,_4> id;
  TPZManVector<long,_4> TStack_68;
  
  iVar1 = pztopology::TPZTetrahedron::SideDimension(side);
  if (iVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "HDivPermutation called with wrong side parameter ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,side);
    std::endl<char,std::char_traits<char>>(poVar3);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x15c);
  }
  uVar2 = pztopology::TPZTetrahedron::NSideNodes(side);
  TPZManVector<long,_4>::TPZManVector(&TStack_68,(long)(int)uVar2);
  uVar4 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = pztopology::TPZTetrahedron::SideNodeLocId(side,(int)uVar4);
    TStack_68.super_TPZVec<long>.fStore[uVar4] =
         (data->fCornerNodeIds).super_TPZVec<long>.fStore[iVar1];
  }
  eltype = pztopology::TPZTetrahedron::Type(side);
  HDivPermutation(eltype,&TStack_68.super_TPZVec<long>,permutegather);
  TPZManVector<long,_4>::~TPZManVector(&TStack_68);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::HDivPermutation(int side, TPZShapeData &data, TPZVec<int> &permutegather) {
    int dimension = TSHAPE::Dimension;
    int sidedimension = TSHAPE::SideDimension(side);

    if(dimension != sidedimension+1)
    {
        std::cout << "HDivPermutation called with wrong side parameter " << side << std::endl;
        DebugStop();
    }
    

    const int nsidenodes = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,4> id(nsidenodes);
    for(int inode=0; inode<nsidenodes; inode++)
    {

        int64_t nodeindex = TSHAPE::SideNodeLocId(side, inode);
//        id[inode] = NodePtr(nodeindex)->Id();
        id[inode] = data.fCornerNodeIds[nodeindex];
    }
    
    MElementType sidetype = TSHAPE::Type(side);
    HDivPermutation(sidetype, id, permutegather);

}